

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# leccalc.cpp
# Opt level: O0

void leccalc::doit(string *subfolder,FILE **fout,bool useReturnPeriodFile,bool skipheader,
                  bool *outputFlags,bool ordFlag,string *parquetFileNames,char *progname)

{
  pointer *this;
  allocator<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>_>
  *this_00;
  uint uVar1;
  uint uVar2;
  OASIS_FLOAT loss;
  int summary_id_00;
  iterator __stream;
  bool bVar3;
  bool bVar4;
  int iVar5;
  bool *outputFlags_00;
  long lVar6;
  char *pcVar7;
  FILE *__stream_00;
  undefined8 uVar8;
  DIR *__dirp;
  dirent *pdVar9;
  ulong uVar10;
  FILE *pFVar11;
  size_type sVar12;
  size_type sVar13;
  mapped_type *this_01;
  pointer ppVar14;
  reference plVar15;
  reference pp_Var16;
  pointer ppVar17;
  reference inFile;
  pair<std::_Rb_tree_const_iterator<int>,_bool> pVar18;
  bool local_15f9;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1588;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1580;
  iterator it_1;
  int local_1568;
  OASIS_FLOAT local_1564;
  sampleslevelRec sr;
  _Rb_tree_const_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_> local_1558
  ;
  iterator local_1550;
  _Rb_tree_const_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_> local_1548
  ;
  const_iterator iter;
  size_t i;
  int local_1530;
  summarySampleslevelHeader sh;
  vector<sampleslevelRec,_std::allocator<sampleslevelRec>_> vrec;
  vector<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>,_std::allocator<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>_>_>
  local_1508;
  _Base_ptr local_14f0;
  undefined1 local_14e8;
  int local_14dc;
  FILE *pFStack_14d8;
  int ret_1;
  FILE *summary_fin;
  FILE *fidx_1;
  int last_file_index;
  int last_summary_id;
  longlong file_offset;
  iterator iStack_14b0;
  int summary_id;
  __normal_iterator<long_long_*,_std::vector<long_long,_std::allocator<long_long>_>_> local_14a8;
  iterator it_v;
  _Self local_1498;
  iterator it_s;
  FILE *fsummaries;
  string summaryFile;
  int ret;
  longlong offset;
  summary_keyz summaryFile_1;
  FILE *fidx_2;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1440;
  iterator it;
  map<summary_keyz,_std::vector<long_long,_std::allocator<long_long>_>,_std::less<summary_keyz>,_std::allocator<std::pair<const_summary_keyz,_std::vector<long_long,_std::allocator<long_long>_>_>_>_>
  summary_file_to_offset;
  char line [4096];
  int file_index;
  FILE *fidx;
  FILE *in;
  byte local_3c9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c8 [39];
  allocator local_3a1;
  string local_3a0 [8];
  string s;
  dirent *ent;
  DIR *dir;
  FILE *flist;
  string fileList;
  undefined1 local_340 [8];
  set<int,_std::less<int>,_std::allocator<int>_> summaryids;
  undefined1 local_308 [4];
  uint samplesize;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  indexFiles;
  vector<_IO_FILE_*,_std::allocator<_IO_FILE_*>_> fileHandles;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  undefined1 local_2b8 [7];
  bool hasEPT;
  vector<int,_std::allocator<int>_> fileIDs_agg;
  vector<int,_std::allocator<int>_> fileIDs_occ;
  aggreports agg;
  undefined1 local_f0 [8];
  vector<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>,_std::allocator<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>_>_>
  out_loss;
  undefined1 local_d0 [4];
  int totalperiods;
  map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  event_to_periods;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70 [32];
  string local_50 [8];
  string path;
  bool ordFlag_local;
  bool *outputFlags_local;
  bool skipheader_local;
  bool useReturnPeriodFile_local;
  FILE **fout_local;
  string *subfolder_local;
  
  std::operator+((char *)local_50,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"work/");
  std::__cxx11::string::length();
  std::__cxx11::string::substr((ulong)local_70,(ulong)local_50);
  bVar3 = std::operator!=(local_70,"/");
  std::__cxx11::string::~string((string *)local_70);
  if (bVar3) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &event_to_periods._M_t._M_impl.super__Rb_tree_header._M_node_count,
                   (char *)local_50);
    std::__cxx11::string::operator=
              (local_50,(string *)&event_to_periods._M_t._M_impl.super__Rb_tree_header._M_node_count
              );
    std::__cxx11::string::~string
              ((string *)&event_to_periods._M_t._M_impl.super__Rb_tree_header._M_node_count);
  }
  std::
  map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  ::map((map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
         *)local_d0);
  loadoccurrence((map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                  *)local_d0,
                 (int *)((long)&out_loss.
                                super__Vector_base<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>,_std::allocator<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  std::
  allocator<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>_>
  ::allocator((allocator<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>_>
               *)&agg.field_0x18f);
  std::
  vector<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>,_std::allocator<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>_>_>
  ::vector((vector<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>,_std::allocator<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>_>_>
            *)local_f0,2,(allocator_type *)&agg.field_0x18f);
  std::
  allocator<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>_>
  ::~allocator((allocator<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>_>
                *)&agg.field_0x18f);
  aggreports::aggreports
            ((aggreports *)
             &fileIDs_occ.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             out_loss.
             super__Vector_base<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>,_std::allocator<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,fout,useReturnPeriodFile,
             outputFlags,ordFlag,parquetFileNames,progname);
  outputFlags_00 =
       aggreports::GetOutputFlags
                 ((aggreports *)
                  &fileIDs_occ.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage);
  this = &fileIDs_agg.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)this);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)local_2b8);
  bVar3 = setupoutputfiles(fout,ordFlag,outputFlags_00,skipheader,
                           (vector<int,_std::allocator<int>_> *)this,
                           (vector<int,_std::allocator<int>_> *)local_2b8,
                           (aggreports *)
                           &fileIDs_occ.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&fileHandles.super__Vector_base<_IO_FILE_*,_std::allocator<_IO_FILE_*>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage);
  std::vector<_IO_FILE_*,_std::allocator<_IO_FILE_*>_>::vector
            ((vector<_IO_FILE_*,_std::allocator<_IO_FILE_*>_> *)
             &indexFiles.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_308);
  summaryids._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 0;
  std::set<int,_std::less<int>,_std::allocator<int>_>::set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)local_340);
  lVar6 = std::__cxx11::string::size();
  if (lVar6 == 0) {
    processinputfile((uint *)((long)&summaryids._M_t._M_impl.super__Rb_tree_header._M_node_count + 4
                             ),
                     (map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                      *)local_d0,(set<int,_std::less<int>,_std::allocator<int>_> *)local_340,
                     (vector<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>,_std::allocator<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>_>_>
                      *)local_f0,useReturnPeriodFile,
                     (aggreports *)
                     &fileIDs_occ.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
    outputaggreports((aggreports *)
                     &fileIDs_occ.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,
                     (set<int,_std::less<int>,_std::allocator<int>_> *)local_340,
                     (vector<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>,_std::allocator<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>_>_>
                      *)local_f0,summaryids._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_,
                     (vector<int,_std::allocator<int>_> *)
                     &fileIDs_agg.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,
                     (vector<int,_std::allocator<int>_> *)local_2b8,bVar3);
  }
  else {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&flist,
                   (char *)local_50);
    pcVar7 = (char *)std::__cxx11::string::c_str();
    __stream_00 = fopen(pcVar7,"w");
    pFVar11 = _stderr;
    if (__stream_00 == (FILE *)0x0) {
      uVar8 = std::__cxx11::string::c_str();
      fprintf(pFVar11,"FATAL: Cannot open %s\n",uVar8);
      exit(1);
    }
    pcVar7 = (char *)std::__cxx11::string::c_str();
    __dirp = opendir(pcVar7);
    pFVar11 = _stderr;
    if (__dirp == (DIR *)0x0) {
      uVar8 = std::__cxx11::string::c_str();
      fprintf(pFVar11,"FATAL: Unable to open directory %s\n",uVar8);
      exit(-1);
    }
    while (pdVar9 = readdir(__dirp), pdVar9 != (dirent *)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_3a0,pdVar9->d_name,&local_3a1);
      std::allocator<char>::~allocator((allocator<char> *)&local_3a1);
      uVar10 = std::__cxx11::string::length();
      local_3c9 = 0;
      local_15f9 = false;
      if (4 < uVar10) {
        std::__cxx11::string::length();
        std::__cxx11::string::substr((ulong)local_3c8,(ulong)local_3a0);
        local_3c9 = 1;
        local_15f9 = std::operator==(local_3c8,".bin");
      }
      if ((local_3c9 & 1) != 0) {
        std::__cxx11::string::~string((string *)local_3c8);
      }
      if (local_15f9 != false) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&in,
                       (char *)local_50);
        std::__cxx11::string::operator=(local_3a0,(string *)&in);
        std::__cxx11::string::~string((string *)&in);
        pcVar7 = (char *)std::__cxx11::string::c_str();
        fidx = (FILE *)fopen(pcVar7,"rb");
        pFVar11 = _stderr;
        if ((FILE *)fidx == (FILE *)0x0) {
          uVar8 = std::__cxx11::string::c_str();
          fprintf(pFVar11,"FATAL: Cannot open %s\n",uVar8);
          exit(1);
        }
        checkinputfile((uint *)((long)&summaryids._M_t._M_impl.super__Rb_tree_header._M_node_count +
                               4),fidx,
                       (aggreports *)
                       &fileIDs_occ.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&fileHandles.super__Vector_base<_IO_FILE_*,_std::allocator<_IO_FILE_*>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage,(value_type *)local_3a0);
        std::vector<_IO_FILE_*,_std::allocator<_IO_FILE_*>_>::push_back
                  ((vector<_IO_FILE_*,_std::allocator<_IO_FILE_*>_> *)
                   &indexFiles.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,&fidx);
        uVar8 = std::__cxx11::string::c_str();
        fprintf(__stream_00,"%s\n",uVar8);
        lVar6 = std::__cxx11::string::length();
        std::__cxx11::string::erase((ulong)local_3a0,lVar6 - 4);
        std::__cxx11::string::operator+=(local_3a0,".idx");
        pcVar7 = (char *)std::__cxx11::string::c_str();
        pFVar11 = fopen(pcVar7,"r");
        if (pFVar11 != (FILE *)0x0) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_308,(value_type *)local_3a0);
          fclose(pFVar11);
        }
      }
      std::__cxx11::string::~string(local_3a0);
    }
    fclose(__stream_00);
    std::__cxx11::string::~string((string *)&flist);
    sVar12 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&fileHandles.super__Vector_base<_IO_FILE_*,_std::allocator<_IO_FILE_*>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage);
    sVar13 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_308);
    if (sVar12 == sVar13) {
      line[0xffc] = '\0';
      line[0xffd] = '\0';
      line[0xffe] = '\0';
      line[0xfff] = '\0';
      std::
      map<summary_keyz,_std::vector<long_long,_std::allocator<long_long>_>,_std::less<summary_keyz>,_std::allocator<std::pair<const_summary_keyz,_std::vector<long_long,_std::allocator<long_long>_>_>_>_>
      ::map((map<summary_keyz,_std::vector<long_long,_std::allocator<long_long>_>,_std::less<summary_keyz>,_std::allocator<std::pair<const_summary_keyz,_std::vector<long_long,_std::allocator<long_long>_>_>_>_>
             *)&it);
      local_1440._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_308);
      while( true ) {
        fidx_2 = (FILE *)std::
                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)local_308);
        bVar4 = __gnu_cxx::operator!=
                          (&local_1440,
                           (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&fidx_2);
        if (!bVar4) break;
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator->(&local_1440);
        pcVar7 = (char *)std::__cxx11::string::c_str();
        summaryFile_1 = (summary_keyz)fopen(pcVar7,"r");
        offset._4_1_ = line[0xffc];
        offset._5_1_ = line[0xffd];
        offset._6_1_ = line[0xffe];
        offset._7_1_ = line[0xfff];
        line._4092_4_ = line._4092_4_ + 1;
        while (pcVar7 = fgets((char *)&summary_file_to_offset._M_t._M_impl.super__Rb_tree_header.
                                       _M_node_count,0x1000,(FILE *)summaryFile_1),
              pcVar7 != (char *)0x0) {
          iVar5 = __isoc99_sscanf(&summary_file_to_offset._M_t._M_impl.super__Rb_tree_header.
                                   _M_node_count,"%d,%lld",&offset,&stack0xffffffffffffeba0);
          pFVar11 = _stderr;
          if (iVar5 != 2) {
            __gnu_cxx::
            __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator->(&local_1440);
            uVar8 = std::__cxx11::string::c_str();
            fprintf(pFVar11,"FATAL: Invalid data in file %s:\n%s",uVar8,
                    &summary_file_to_offset._M_t._M_impl.super__Rb_tree_header._M_node_count);
            exit(-1);
          }
          this_01 = std::
                    map<summary_keyz,_std::vector<long_long,_std::allocator<long_long>_>,_std::less<summary_keyz>,_std::allocator<std::pair<const_summary_keyz,_std::vector<long_long,_std::allocator<long_long>_>_>_>_>
                    ::operator[]((map<summary_keyz,_std::vector<long_long,_std::allocator<long_long>_>,_std::less<summary_keyz>,_std::allocator<std::pair<const_summary_keyz,_std::vector<long_long,_std::allocator<long_long>_>_>_>_>
                                  *)&it,(key_type *)&offset);
          std::vector<long_long,_std::allocator<long_long>_>::push_back
                    (this_01,(value_type_conflict1 *)&stack0xffffffffffffeba0);
        }
        fclose((FILE *)summaryFile_1);
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&local_1440);
      }
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &fsummaries,(char *)local_50);
      pcVar7 = (char *)std::__cxx11::string::c_str();
      it_s._M_node = (_Base_ptr)fopen(pcVar7,"w");
      pFVar11 = _stderr;
      if ((FILE *)it_s._M_node == (FILE *)0x0) {
        uVar8 = std::__cxx11::string::c_str();
        fprintf(pFVar11,"Cannot open %s\n",uVar8);
        exit(1);
      }
      local_1498._M_node =
           (_Base_ptr)
           std::
           map<summary_keyz,_std::vector<long_long,_std::allocator<long_long>_>,_std::less<summary_keyz>,_std::allocator<std::pair<const_summary_keyz,_std::vector<long_long,_std::allocator<long_long>_>_>_>_>
           ::begin((map<summary_keyz,_std::vector<long_long,_std::allocator<long_long>_>,_std::less<summary_keyz>,_std::allocator<std::pair<const_summary_keyz,_std::vector<long_long,_std::allocator<long_long>_>_>_>_>
                    *)&it);
      while( true ) {
        it_v._M_current =
             (longlong *)
             std::
             map<summary_keyz,_std::vector<long_long,_std::allocator<long_long>_>,_std::less<summary_keyz>,_std::allocator<std::pair<const_summary_keyz,_std::vector<long_long,_std::allocator<long_long>_>_>_>_>
             ::end((map<summary_keyz,_std::vector<long_long,_std::allocator<long_long>_>,_std::less<summary_keyz>,_std::allocator<std::pair<const_summary_keyz,_std::vector<long_long,_std::allocator<long_long>_>_>_>_>
                    *)&it);
        bVar4 = std::operator!=(&local_1498,(_Self *)&it_v);
        if (!bVar4) break;
        ppVar14 = std::
                  _Rb_tree_iterator<std::pair<const_summary_keyz,_std::vector<long_long,_std::allocator<long_long>_>_>_>
                  ::operator->(&local_1498);
        local_14a8._M_current =
             (longlong *)std::vector<long_long,_std::allocator<long_long>_>::begin(&ppVar14->second)
        ;
        while( true ) {
          ppVar14 = std::
                    _Rb_tree_iterator<std::pair<const_summary_keyz,_std::vector<long_long,_std::allocator<long_long>_>_>_>
                    ::operator->(&local_1498);
          iStack_14b0 = std::vector<long_long,_std::allocator<long_long>_>::end(&ppVar14->second);
          bVar4 = __gnu_cxx::operator!=(&local_14a8,&stack0xffffffffffffeb50);
          __stream = it_s;
          if (!bVar4) break;
          ppVar14 = std::
                    _Rb_tree_iterator<std::pair<const_summary_keyz,_std::vector<long_long,_std::allocator<long_long>_>_>_>
                    ::operator->(&local_1498);
          uVar1 = (ppVar14->first).summary_id;
          ppVar14 = std::
                    _Rb_tree_iterator<std::pair<const_summary_keyz,_std::vector<long_long,_std::allocator<long_long>_>_>_>
                    ::operator->(&local_1498);
          uVar2 = (ppVar14->first).fileindex;
          plVar15 = __gnu_cxx::
                    __normal_iterator<long_long_*,_std::vector<long_long,_std::allocator<long_long>_>_>
                    ::operator*(&local_14a8);
          fprintf((FILE *)__stream._M_node,"%d,%d,%lld\n",(ulong)uVar1,(ulong)uVar2,*plVar15);
          __gnu_cxx::
          __normal_iterator<long_long_*,_std::vector<long_long,_std::allocator<long_long>_>_>::
          operator++(&local_14a8);
        }
        std::
        _Rb_tree_iterator<std::pair<const_summary_keyz,_std::vector<long_long,_std::allocator<long_long>_>_>_>
        ::operator++(&local_1498);
      }
      std::
      map<summary_keyz,_std::vector<long_long,_std::allocator<long_long>_>,_std::less<summary_keyz>,_std::allocator<std::pair<const_summary_keyz,_std::vector<long_long,_std::allocator<long_long>_>_>_>_>
      ::clear((map<summary_keyz,_std::vector<long_long,_std::allocator<long_long>_>,_std::less<summary_keyz>,_std::allocator<std::pair<const_summary_keyz,_std::vector<long_long,_std::allocator<long_long>_>_>_>_>
               *)&it);
      fclose((FILE *)it_s._M_node);
      line[0xffc] = '\0';
      line[0xffd] = '\0';
      line[0xffe] = '\0';
      line[0xfff] = '\0';
      fidx_1._4_4_ = -1;
      fidx_1._0_4_ = -1;
      pcVar7 = (char *)std::__cxx11::string::c_str();
      summary_fin = (FILE *)fopen(pcVar7,"r");
      pFStack_14d8 = (FILE *)0x0;
      while (pcVar7 = fgets((char *)&summary_file_to_offset._M_t._M_impl.super__Rb_tree_header.
                                     _M_node_count,0x1000,(FILE *)summary_fin),
            pcVar7 != (char *)0x0) {
        local_14dc = __isoc99_sscanf(&summary_file_to_offset._M_t._M_impl.super__Rb_tree_header.
                                      _M_node_count,"%d,%d,%lld",(long)&file_offset + 4,line + 0xffc
                                     ,&last_file_index);
        pFVar11 = _stderr;
        if (local_14dc != 3) {
          uVar8 = std::__cxx11::string::c_str();
          fprintf(pFVar11,"FATAL: Invalid data in file %s:\n%s",uVar8,
                  &summary_file_to_offset._M_t._M_impl.super__Rb_tree_header._M_node_count);
          exit(-1);
        }
        if (fidx_1._4_4_ != file_offset._4_4_) {
          if (fidx_1._4_4_ != -1) {
            std::set<int,_std::less<int>,_std::allocator<int>_>::clear
                      ((set<int,_std::less<int>,_std::allocator<int>_> *)local_340);
            pVar18 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                               ((set<int,_std::less<int>,_std::allocator<int>_> *)local_340,
                                (value_type_conflict *)((long)&fidx_1 + 4));
            local_14f0 = (_Base_ptr)pVar18.first._M_node;
            local_14e8 = pVar18.second;
            outputaggreports((aggreports *)
                             &fileIDs_occ.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage,
                             (set<int,_std::less<int>,_std::allocator<int>_> *)local_340,
                             (vector<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>,_std::allocator<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>_>_>
                              *)local_f0,
                             summaryids._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_,
                             (vector<int,_std::allocator<int>_> *)
                             &fileIDs_agg.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage,
                             (vector<int,_std::allocator<int>_> *)local_2b8,bVar3);
            this_00 = (allocator<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>_>
                       *)((long)&vrec.
                                 super__Vector_base<sampleslevelRec,_std::allocator<sampleslevelRec>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
            std::
            allocator<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>_>
            ::allocator(this_00);
            std::
            vector<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>,_std::allocator<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>_>_>
            ::vector(&local_1508,2,this_00);
            std::
            vector<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>,_std::allocator<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>_>_>
            ::operator=((vector<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>,_std::allocator<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>_>_>
                         *)local_f0,&local_1508);
            std::
            vector<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>,_std::allocator<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>_>_>
            ::~vector(&local_1508);
            std::
            allocator<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>_>
            ::~allocator((allocator<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>_>
                          *)((long)&vrec.
                                    super__Vector_base<sampleslevelRec,_std::allocator<sampleslevelRec>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
          }
          fidx_1._4_4_ = file_offset._4_4_;
        }
        if ((int)fidx_1 != line._4092_4_) {
          pp_Var16 = std::vector<_IO_FILE_*,_std::allocator<_IO_FILE_*>_>::operator[]
                               ((vector<_IO_FILE_*,_std::allocator<_IO_FILE_*>_> *)
                                &indexFiles.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                (long)(int)line._4092_4_);
          pFStack_14d8 = (FILE *)*pp_Var16;
          fidx_1._0_1_ = line[0xffc];
          fidx_1._1_1_ = line[0xffd];
          fidx_1._2_1_ = line[0xffe];
          fidx_1._3_1_ = line[0xfff];
        }
        if (pFStack_14d8 != (FILE *)0x0) {
          std::vector<sampleslevelRec,_std::allocator<sampleslevelRec>_>::vector
                    ((vector<sampleslevelRec,_std::allocator<sampleslevelRec>_> *)&sh.summary_id);
          fseek(pFStack_14d8,_last_file_index,0);
          iter._M_node = (_Base_ptr)fread((void *)((long)&i + 4),0xc,1,pFStack_14d8);
          local_1550._M_node =
               (_Base_ptr)
               std::
               map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
               ::find((map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                       *)local_d0,(key_type *)((long)&i + 4));
          std::
          _Rb_tree_const_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>::
          _Rb_tree_const_iterator(&local_1548,&local_1550);
          sr = (sampleslevelRec)
               std::
               map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
               ::end((map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                      *)local_d0);
          std::
          _Rb_tree_const_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>::
          _Rb_tree_const_iterator(&local_1558,(iterator *)&sr);
          bVar4 = std::operator==(&local_1548,&local_1558);
          if (!bVar4) {
            while (((iter._M_node != (_Base_ptr)0x0 &&
                    (iter._M_node = (_Base_ptr)fread(&local_1568,8,1,pFStack_14d8),
                    summary_id_00 = local_1530, loss = local_1564, iVar5 = local_1568,
                    iter._M_node == (_Base_ptr)0x1)) && (local_1568 != 0))) {
              if ((local_1568 != -4) && (local_1568 != -5)) {
                ppVar17 = std::
                          _Rb_tree_const_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>
                          ::operator->(&local_1548);
                dolecoutputaggsummary
                          (summary_id_00,iVar5,loss,&ppVar17->second,
                           (vector<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>,_std::allocator<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>_>_>
                            *)local_f0);
              }
            }
          }
          std::vector<sampleslevelRec,_std::allocator<sampleslevelRec>_>::~vector
                    ((vector<sampleslevelRec,_std::allocator<sampleslevelRec>_> *)&sh.summary_id);
        }
      }
      std::set<int,_std::less<int>,_std::allocator<int>_>::clear
                ((set<int,_std::less<int>,_std::allocator<int>_> *)local_340);
      pVar18 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                         ((set<int,_std::less<int>,_std::allocator<int>_> *)local_340,
                          (value_type_conflict *)((long)&fidx_1 + 4));
      it_1._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pVar18.first._M_node
      ;
      outputaggreports((aggreports *)
                       &fileIDs_occ.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage,
                       (set<int,_std::less<int>,_std::allocator<int>_> *)local_340,
                       (vector<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>,_std::allocator<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>_>_>
                        *)local_f0,summaryids._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_
                       ,(vector<int,_std::allocator<int>_> *)
                        &fileIDs_agg.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage,
                       (vector<int,_std::allocator<int>_> *)local_2b8,bVar3);
      std::__cxx11::string::~string((string *)&fsummaries);
      std::
      map<summary_keyz,_std::vector<long_long,_std::allocator<long_long>_>,_std::less<summary_keyz>,_std::allocator<std::pair<const_summary_keyz,_std::vector<long_long,_std::allocator<long_long>_>_>_>_>
      ::~map((map<summary_keyz,_std::vector<long_long,_std::allocator<long_long>_>,_std::less<summary_keyz>,_std::allocator<std::pair<const_summary_keyz,_std::vector<long_long,_std::allocator<long_long>_>_>_>_>
              *)&it);
    }
    else {
      sVar12 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_308);
      pFVar11 = _stderr;
      if (sVar12 != 0) {
        sVar12 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_308);
        sVar13 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&fileHandles.super__Vector_base<_IO_FILE_*,_std::allocator<_IO_FILE_*>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage);
        fprintf(pFVar11,"%d summary index files missing: Ignoring summary index files.\n",
                (ulong)(uint)((int)sVar12 - (int)sVar13));
      }
      local_1580._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&fileHandles.super__Vector_base<_IO_FILE_*,_std::allocator<_IO_FILE_*>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage);
      while( true ) {
        local_1588._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&fileHandles.super__Vector_base<_IO_FILE_*,_std::allocator<_IO_FILE_*>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage);
        bVar4 = __gnu_cxx::operator!=(&local_1580,&local_1588);
        if (!bVar4) break;
        inFile = __gnu_cxx::
                 __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&local_1580);
        setinputstream(inFile);
        processinputfile((uint *)((long)&summaryids._M_t._M_impl.super__Rb_tree_header._M_node_count
                                 + 4),
                         (map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                          *)local_d0,(set<int,_std::less<int>,_std::allocator<int>_> *)local_340,
                         (vector<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>,_std::allocator<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>_>_>
                          *)local_f0,useReturnPeriodFile,
                         (aggreports *)
                         &fileIDs_occ.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&local_1580);
      }
      outputaggreports((aggreports *)
                       &fileIDs_occ.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage,
                       (set<int,_std::less<int>,_std::allocator<int>_> *)local_340,
                       (vector<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>,_std::allocator<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>_>_>
                        *)local_f0,summaryids._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_
                       ,(vector<int,_std::allocator<int>_> *)
                        &fileIDs_agg.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage,
                       (vector<int,_std::allocator<int>_> *)local_2b8,bVar3);
    }
  }
  std::set<int,_std::less<int>,_std::allocator<int>_>::~set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)local_340);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_308);
  std::vector<_IO_FILE_*,_std::allocator<_IO_FILE_*>_>::~vector
            ((vector<_IO_FILE_*,_std::allocator<_IO_FILE_*>_> *)
             &indexFiles.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&fileHandles.super__Vector_base<_IO_FILE_*,_std::allocator<_IO_FILE_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_2b8);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)
             &fileIDs_agg.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  aggreports::~aggreports
            ((aggreports *)
             &fileIDs_occ.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>,_std::allocator<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>_>_>
  ::~vector((vector<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>,_std::allocator<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>_>_>
             *)local_f0);
  std::
  map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  ::~map((map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
          *)local_d0);
  std::__cxx11::string::~string(local_50);
  return;
}

Assistant:

void doit(const std::string &subfolder, FILE **fout,
		  const bool useReturnPeriodFile, bool skipheader,
		  bool *outputFlags, bool ordFlag,
		  const std::string *parquetFileNames,
		  const char *progname)
	{
		std::string path = "work/" + subfolder;
		if (path.substr(path.length() - 1, 1) != "/") {
			path = path + "/";
		}
		std::map<int, std::vector<int> > event_to_periods;
		int totalperiods;
		loadoccurrence(event_to_periods, totalperiods);
		std::vector<std::map<outkey2, OutLosses>> out_loss(2);

		aggreports agg(totalperiods, fout, useReturnPeriodFile,
			       outputFlags, ordFlag, parquetFileNames,
			       progname);
		outputFlags = agg.GetOutputFlags();

		std::vector<int> fileIDs_occ, fileIDs_agg;
		bool hasEPT = setupoutputfiles(fout, ordFlag, outputFlags,
					       skipheader, fileIDs_occ,
					       fileIDs_agg, agg);

		std::vector<std::string> files;
		std::vector<FILE*> fileHandles;
		std::vector<std::string> indexFiles;
		unsigned int samplesize=0;
		std::set<int> summaryids;
		if (subfolder.size() == 0) {
			processinputfile(samplesize, event_to_periods,
					 summaryids, out_loss,
					 useReturnPeriodFile, agg);
			outputaggreports(agg, summaryids, out_loss, samplesize,
					 fileIDs_occ, fileIDs_agg, hasEPT);
			return;
		} else {
			// Store order of input files for future reference
			std::string fileList = path + "filelist.idx";
			FILE * flist = fopen(fileList.c_str(), "w");
			if (flist == nullptr) {
				fprintf(stderr, "FATAL: Cannot open %s\n", fileList.c_str());
				exit(EXIT_FAILURE);
			}
			DIR* dir;
			struct dirent* ent;
			if ((dir = opendir(path.c_str())) != NULL) {
				while ((ent = readdir(dir)) != NULL) {
					std::string s = ent->d_name;
					if (s.length() > 4 && s.substr(s.length() - 4, 4) == ".bin") {
						s = path + ent->d_name;
						FILE * in = fopen(s.c_str(), "rb");
						if (in != nullptr) {
							checkinputfile(samplesize, in, agg);
						} else {
							fprintf(stderr, "FATAL: Cannot open %s\n", s.c_str());
							exit(EXIT_FAILURE);
						}
						files.push_back(s);   // Build input file list
						fileHandles.push_back(in);
						fprintf(flist, "%s\n", s.c_str());
						// Check for index file
						s.erase(s.length() - 4);
						s += ".idx";
						FILE * fidx = fopen(s.c_str(), "r");
						if (fidx == nullptr) continue;
						indexFiles.push_back(s);
						fclose(fidx);
					}
				}
			}
			else {
				fprintf(stderr, "FATAL: Unable to open directory %s\n", path.c_str());
				exit(-1);
			}
			fclose(flist);
		}

		if (files.size() == indexFiles.size()) {
			// Combine summary index files into one master summary index file
			int file_index = 0;
			char line[4096];
			std::map<summary_keyz, std::vector<long long>> summary_file_to_offset;
			for (std::vector<std::string>::iterator it = indexFiles.begin(); it != indexFiles.end(); ++it) {
				FILE * fidx = fopen(it->c_str(), "r");
				summary_keyz summaryFile;
				summaryFile.fileindex = file_index++;
				while (fgets(line, sizeof(line), fidx) != 0) {
					long long offset;
					int ret = sscanf(line, "%d,%lld", &summaryFile.summary_id, &offset);
					if (ret != 2) {
						fprintf(stderr, "FATAL: Invalid data in file %s:\n%s",
							it->c_str(), line);
						exit(-1);
					}
					summary_file_to_offset[summaryFile].push_back(offset);
				}
				fclose(fidx);
			}
			std::string summaryFile = path + "summaries.idx";
			FILE * fsummaries = fopen(summaryFile.c_str(), "w");
			if (fsummaries == nullptr) {
				fprintf(stderr, "Cannot open %s\n", summaryFile.c_str());
				exit(EXIT_FAILURE);
			}
			for (std::map<summary_keyz, std::vector<long long>>::iterator it_s = summary_file_to_offset.begin();
			     it_s != summary_file_to_offset.end(); ++it_s) {
				for(std::vector<long long>::iterator it_v = it_s->second.begin(); it_v != it_s->second.end(); ++it_v) {
					fprintf(fsummaries, "%d,%d,%lld\n", it_s->first.summary_id, it_s->first.fileindex, *it_v);
				}
			}
			summary_file_to_offset.clear();   // Recover memory
			fclose(fsummaries);

			// Read input files by summary ID using master summary index file
			int summary_id;
			file_index = 0;
			long long file_offset;
			int last_summary_id = -1;
			int last_file_index = -1;
			FILE * fidx = fopen(summaryFile.c_str(), "r");
			FILE * summary_fin = nullptr;
			while (fgets(line, sizeof(line), fidx) != 0) {
				int ret = sscanf(line, "%d,%d,%lld", &summary_id, &file_index, &file_offset);
				if (ret != 3) {
					fprintf(stderr, "FATAL: Invalid data in file %s:\n%s", summaryFile.c_str(), line);
					exit(-1);
				}
				if (last_summary_id != summary_id) {
					if (last_summary_id != -1) {
						summaryids.clear();
						summaryids.insert(last_summary_id);
						outputaggreports(agg, summaryids, out_loss, samplesize, fileIDs_occ, fileIDs_agg, hasEPT);
						out_loss = std::vector<std::map<outkey2, OutLosses>>(2);   // Reset
						skipheader = true;   // Only print header for first summary ID if requested
					}
					last_summary_id = summary_id;
				}
				if (last_file_index != file_index) {
					summary_fin = fileHandles[file_index];
					last_file_index = file_index;
				}
				if (summary_fin != nullptr) {
					std::vector<sampleslevelRec> vrec;
					flseek(summary_fin, file_offset, SEEK_SET);
					summarySampleslevelHeader sh;
					size_t i = fread(&sh, sizeof(sh), 1, summary_fin);
					std::map<int, std::vector<int> >::const_iterator iter = event_to_periods.find(sh.event_id);
					if (iter == event_to_periods.end()) continue;   // Event not found so don't process it
					while (i != 0) {
						sampleslevelRec sr;
						i = fread(&sr, sizeof(sr), 1, summary_fin);
						if (i != 1 || sr.sidx == 0) break;
						if (sr.sidx == number_of_affected_risk_idx || sr.sidx == max_loss_idx) continue;
						dolecoutputaggsummary(sh.summary_id, sr.sidx, sr.loss, iter->second, out_loss);
					}
				}
			}
			summaryids.clear();
			summaryids.insert(last_summary_id);
			outputaggreports(agg, summaryids, out_loss, samplesize,
					 fileIDs_occ, fileIDs_agg, hasEPT);
		} else {
			if (indexFiles.size() > 0) {
				fprintf(stderr, "%d summary index files missing: "
						"Ignoring summary index files.\n",
					(int)indexFiles.size() - (int)files.size());
			}
			for (std::vector<std::string>::iterator it = files.begin(); it != files.end(); ++it) {
				setinputstream(*it);
				processinputfile(samplesize, event_to_periods,
						 summaryids, out_loss,
						 useReturnPeriodFile, agg);
			}
			outputaggreports(agg, summaryids, out_loss, samplesize,
					 fileIDs_occ, fileIDs_agg, hasEPT);
		}
	}